

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferSparseBinding.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::sparse::anon_unknown_3::BufferSparseBindingInstance::iterate
          (TestStatus *__return_storage_ptr__,BufferSparseBindingInstance *this)

{
  DeviceDriver *vk;
  void *__s2;
  VkDeviceSize VVar1;
  deUint32 dVar2;
  VkResult result;
  int iVar3;
  InstanceInterface *vk_00;
  VkPhysicalDevice physicalDevice;
  Queue *pQVar4;
  ulong uVar5;
  NotSupportedError *pNVar6;
  deUint32 valueNdx;
  ulong uVar7;
  allocator<char> local_5ad;
  deUint32 local_5ac;
  RefBase<vk::VkCommandBuffer_s_*> local_5a8;
  Queue *local_580;
  Queue *local_578;
  deUint32 queueFamilyIndices [2];
  VkSparseBufferMemoryBindInfo sparseBufferBindInfo;
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> outputBufferAlloc;
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> inputBufferAlloc;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_508;
  VkBufferCreateInfo outputBufferCreateInfo;
  vector<unsigned_char,_std::allocator<unsigned_char>_> referenceData;
  VkPipelineStageFlags waitStageBits [1];
  RefBase<vk::Handle<(vk::HandleType)8>_> local_478;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_458;
  VkBufferCreateInfo bufferCreateInfo;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  deviceMemUniquePtrVec;
  VkMemoryRequirements bufferMemRequirement;
  RefBase<vk::Handle<(vk::HandleType)4>_> local_3c8;
  RefBase<vk::Handle<(vk::HandleType)7>_> local_3a8;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_388;
  VkBufferCreateInfo inputBufferCreateInfo;
  VkBool32 local_2b8;
  ulong local_208;
  
  vk_00 = Context::getInstanceInterface
                    ((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context);
  physicalDevice =
       Context::getPhysicalDevice
                 ((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context);
  ::vk::getPhysicalDeviceFeatures
            ((VkPhysicalDeviceFeatures *)&inputBufferCreateInfo,vk_00,physicalDevice);
  if (local_2b8 == 0) {
    pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar6,"Sparse binding not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesBufferSparseBinding.cpp"
               ,0x68);
    __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  inputBufferCreateInfo.flags = 0;
  inputBufferCreateInfo._20_4_ = 0;
  inputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  inputBufferCreateInfo._4_4_ = 0;
  inputBufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_FENCE_CREATE_INFO;
  bufferCreateInfo._4_4_ = 1;
  std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>::
  emplace_back<vkt::sparse::QueueRequirements>
            ((vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
              *)&inputBufferCreateInfo,(QueueRequirements *)&bufferCreateInfo);
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
  bufferCreateInfo._4_4_ = 1;
  std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>::
  emplace_back<vkt::sparse::QueueRequirements>
            ((vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
              *)&inputBufferCreateInfo,(QueueRequirements *)&bufferCreateInfo);
  SparseResourcesBaseInstance::createDeviceSupportingQueues
            (&this->super_SparseResourcesBaseInstance,(QueueRequirementsVec *)&inputBufferCreateInfo
            );
  std::_Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
  ::~_Vector_base((_Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                   *)&inputBufferCreateInfo);
  vk = (this->super_SparseResourcesBaseInstance).m_deviceDriver.
       super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>.m_data.ptr;
  pQVar4 = SparseResourcesBaseInstance::getQueue(&this->super_SparseResourcesBaseInstance,8,0);
  local_578 = SparseResourcesBaseInstance::getQueue(&this->super_SparseResourcesBaseInstance,2,0);
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 1;
  bufferCreateInfo.size = (VkDeviceSize)this->m_bufferSize;
  bufferCreateInfo.usage = 3;
  bufferCreateInfo.queueFamilyIndexCount = 0;
  bufferCreateInfo.pQueueFamilyIndices = (deUint32 *)0x0;
  queueFamilyIndices[0] = pQVar4->queueFamilyIndex;
  queueFamilyIndices[1] = local_578->queueFamilyIndex;
  if (queueFamilyIndices[0] != queueFamilyIndices[1]) {
    bufferCreateInfo.queueFamilyIndexCount = 2;
    bufferCreateInfo.pQueueFamilyIndices = queueFamilyIndices;
  }
  bufferCreateInfo.sharingMode = (VkSharingMode)(queueFamilyIndices[0] != queueFamilyIndices[1]);
  local_580 = pQVar4;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&inputBufferCreateInfo,
                     &vk->super_DeviceInterface,
                     (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                     super_RefBase<vk::VkDevice_s_*>.m_data.object,&bufferCreateInfo,
                     (VkAllocationCallbacks *)0x0);
  local_508.m_data.deleter.m_device = (VkDevice)inputBufferCreateInfo._16_8_;
  local_508.m_data.deleter.m_allocator = (VkAllocationCallbacks *)inputBufferCreateInfo.size;
  local_508.m_data.object.m_internal = inputBufferCreateInfo._0_8_;
  local_508.m_data.deleter.m_deviceIface = (DeviceInterface *)inputBufferCreateInfo.pNext;
  inputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  inputBufferCreateInfo._4_4_ = 0;
  inputBufferCreateInfo.pNext = (void *)0x0;
  inputBufferCreateInfo.flags = 0;
  inputBufferCreateInfo._20_4_ = 0;
  inputBufferCreateInfo.size = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&inputBufferCreateInfo);
  ::vk::createSemaphore
            ((Move<vk::Handle<(vk::HandleType)4>_> *)&inputBufferCreateInfo,
             &vk->super_DeviceInterface,
             (this->super_SparseResourcesBaseInstance).m_logicalDevice.
             super_RefBase<vk::VkDevice_s_*>.m_data.object,0,(VkAllocationCallbacks *)0x0);
  local_3c8.m_data.deleter.m_device = (VkDevice)inputBufferCreateInfo._16_8_;
  local_3c8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)inputBufferCreateInfo.size;
  local_3c8.m_data.object.m_internal = inputBufferCreateInfo._0_8_;
  local_3c8.m_data.deleter.m_deviceIface = (DeviceInterface *)inputBufferCreateInfo.pNext;
  inputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  inputBufferCreateInfo._4_4_ = 0;
  inputBufferCreateInfo.pNext = (void *)0x0;
  inputBufferCreateInfo.flags = 0;
  inputBufferCreateInfo._20_4_ = 0;
  inputBufferCreateInfo.size = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)4>_> *)&inputBufferCreateInfo);
  ::vk::getBufferMemoryRequirements
            (&bufferMemRequirement,&vk->super_DeviceInterface,
             (this->super_SparseResourcesBaseInstance).m_logicalDevice.
             super_RefBase<vk::VkDevice_s_*>.m_data.object,
             (VkBuffer)local_508.m_data.object.m_internal);
  VVar1 = bufferMemRequirement.size;
  ::vk::getPhysicalDeviceProperties
            ((VkPhysicalDeviceProperties *)&inputBufferCreateInfo,vk_00,physicalDevice);
  if (VVar1 <= local_208) {
    deviceMemUniquePtrVec.
    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    deviceMemUniquePtrVec.
    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    deviceMemUniquePtrVec.
    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    outputBufferCreateInfo.flags = 0;
    outputBufferCreateInfo._20_4_ = 0;
    outputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    outputBufferCreateInfo._4_4_ = 0;
    outputBufferCreateInfo.pNext = (void *)0x0;
    uVar5 = bufferMemRequirement.size / bufferMemRequirement.alignment;
    dVar2 = findMatchingMemoryType
                      (vk_00,physicalDevice,&bufferMemRequirement,
                       (MemoryRequirement *)&::vk::MemoryRequirement::Any);
    if (dVar2 == 0xffffffff) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&inputBufferCreateInfo,"No matching memory type found",
                 (allocator<char> *)&sparseBufferBindInfo);
      tcu::TestStatus::fail(__return_storage_ptr__,(string *)&inputBufferCreateInfo);
      pQVar4 = local_580;
      std::__cxx11::string::~string((string *)&inputBufferCreateInfo);
    }
    else {
      local_5ac = dVar2;
      for (uVar7 = 0; pQVar4 = local_580, uVar7 < (uVar5 & 0xffffffff); uVar7 = uVar7 + 1) {
        makeSparseMemoryBind
                  ((VkSparseMemoryBind *)&inputBufferCreateInfo,&vk->super_DeviceInterface,
                   (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                   super_RefBase<vk::VkDevice_s_*>.m_data.object,bufferMemRequirement.alignment,
                   local_5ac,bufferMemRequirement.alignment * uVar7);
        local_3a8.m_data.object.m_internal =
             (deUint64)
             ::vk::refdetails::check<vk::Handle<(vk::HandleType)7>>
                       ((Handle<(vk::HandleType)7>)inputBufferCreateInfo._16_8_);
        local_3a8.m_data.deleter.m_device =
             (this->super_SparseResourcesBaseInstance).m_logicalDevice.
             super_RefBase<vk::VkDevice_s_*>.m_data.object;
        local_3a8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
        local_3a8.m_data.deleter.m_deviceIface = &vk->super_DeviceInterface;
        makeVkSharedPtr<vk::Handle<(vk::HandleType)7>>
                  ((sparse *)&sparseBufferBindInfo,
                   (Move<vk::Handle<(vk::HandleType)7>_> *)&local_3a8);
        std::
        vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>>
        ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>
                  ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>>
                    *)&deviceMemUniquePtrVec,
                   (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_> *)
                   &sparseBufferBindInfo);
        de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>::~SharedPtr
                  ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_> *)
                   &sparseBufferBindInfo);
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::~RefBase(&local_3a8);
        std::vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::push_back
                  ((vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> *)
                   &outputBufferCreateInfo,(value_type *)&inputBufferCreateInfo);
      }
      inputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_BIND_SPARSE_INFO;
      inputBufferCreateInfo.pNext = (void *)0x0;
      inputBufferCreateInfo._16_8_ = inputBufferCreateInfo._16_8_ & 0xffffffff00000000;
      inputBufferCreateInfo.size = 0;
      sparseBufferBindInfo.buffer.m_internal = local_508.m_data.object.m_internal;
      inputBufferCreateInfo.usage = 1;
      inputBufferCreateInfo.pQueueFamilyIndices._0_4_ = 0;
      sparseBufferBindInfo.bindCount = (deUint32)uVar5;
      sparseBufferBindInfo.pBinds = (VkSparseMemoryBind *)outputBufferCreateInfo._0_8_;
      inputBufferCreateInfo._40_8_ = &sparseBufferBindInfo;
      result = (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x11])(vk,local_580->queueHandle)
      ;
      ::vk::checkResult(result,
                        "deviceInterface.queueBindSparse(sparseQueue.queueHandle, 1u, &bindSparseInfo, DE_NULL)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesBufferSparseBinding.cpp"
                        ,0xbf);
      dVar2 = local_5ac;
    }
    std::_Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::
    ~_Vector_base((_Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> *)
                  &outputBufferCreateInfo);
    if (dVar2 != 0xffffffff) {
      makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&inputBufferCreateInfo,
                      &vk->super_DeviceInterface,
                      (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                      super_RefBase<vk::VkDevice_s_*>.m_data.object,local_578->queueFamilyIndex);
      local_388.m_data.deleter.m_device = (VkDevice)inputBufferCreateInfo._16_8_;
      local_388.m_data.deleter.m_allocator = (VkAllocationCallbacks *)inputBufferCreateInfo.size;
      local_388.m_data.object.m_internal = inputBufferCreateInfo._0_8_;
      local_388.m_data.deleter.m_deviceIface = (DeviceInterface *)inputBufferCreateInfo.pNext;
      inputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      inputBufferCreateInfo._4_4_ = 0;
      inputBufferCreateInfo.pNext = (void *)0x0;
      inputBufferCreateInfo.flags = 0;
      inputBufferCreateInfo._20_4_ = 0;
      inputBufferCreateInfo.size = 0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&inputBufferCreateInfo);
      ::vk::allocateCommandBuffer
                ((Move<vk::VkCommandBuffer_s_*> *)&inputBufferCreateInfo,&vk->super_DeviceInterface,
                 (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                 super_RefBase<vk::VkDevice_s_*>.m_data.object,
                 (VkCommandPool)local_388.m_data.object.m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
      local_5a8.m_data.deleter.m_device = (VkDevice)inputBufferCreateInfo._16_8_;
      local_5a8.m_data.deleter.m_pool.m_internal = inputBufferCreateInfo.size;
      local_5a8.m_data.object = (VkCommandBuffer_s *)inputBufferCreateInfo._0_8_;
      local_5a8.m_data.deleter.m_deviceIface = (DeviceInterface *)inputBufferCreateInfo.pNext;
      inputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      inputBufferCreateInfo._4_4_ = 0;
      inputBufferCreateInfo.pNext = (void *)0x0;
      inputBufferCreateInfo.flags = 0;
      inputBufferCreateInfo._20_4_ = 0;
      inputBufferCreateInfo.size = 0;
      ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
                ((RefBase<vk::VkCommandBuffer_s_*> *)&inputBufferCreateInfo);
      beginCommandBuffer(&vk->super_DeviceInterface,local_5a8.m_data.object);
      makeBufferCreateInfo(&inputBufferCreateInfo,(ulong)this->m_bufferSize,1);
      ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&outputBufferCreateInfo,
                         &vk->super_DeviceInterface,
                         (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                         super_RefBase<vk::VkDevice_s_*>.m_data.object,&inputBufferCreateInfo,
                         (VkAllocationCallbacks *)0x0);
      local_458.m_data.deleter.m_device = (VkDevice)outputBufferCreateInfo._16_8_;
      local_458.m_data.deleter.m_allocator = (VkAllocationCallbacks *)outputBufferCreateInfo.size;
      local_458.m_data.object.m_internal = outputBufferCreateInfo._0_8_;
      local_458.m_data.deleter.m_deviceIface = (DeviceInterface *)outputBufferCreateInfo.pNext;
      outputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      outputBufferCreateInfo._4_4_ = 0;
      outputBufferCreateInfo.pNext = (void *)0x0;
      outputBufferCreateInfo.flags = 0;
      outputBufferCreateInfo._20_4_ = 0;
      outputBufferCreateInfo.size = 0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&outputBufferCreateInfo);
      bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                 &outputBufferCreateInfo,&vk->super_DeviceInterface,
                 (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                 super_RefBase<vk::VkDevice_s_*>.m_data.object,
                 (this->super_SparseResourcesBaseInstance).m_allocator.
                 super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr,
                 (VkBuffer)local_458.m_data.object.m_internal,(MemoryRequirement)0x1);
      inputBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
      ptr = (Allocation *)outputBufferCreateInfo._0_8_;
      outputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      outputBufferCreateInfo._4_4_ = 0;
      de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                 &outputBufferCreateInfo);
      referenceData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      referenceData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      referenceData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&referenceData,(ulong)this->m_bufferSize);
      for (uVar5 = 0; uVar5 < this->m_bufferSize; uVar5 = uVar5 + 1) {
        referenceData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar5] =
             (char)(uVar5 % bufferMemRequirement.alignment) + '\x01';
      }
      memcpy((inputBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
              .m_data.ptr)->m_hostPtr,
             referenceData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start,(ulong)this->m_bufferSize);
      ::vk::flushMappedMemoryRange
                (&vk->super_DeviceInterface,
                 (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                 super_RefBase<vk::VkDevice_s_*>.m_data.object,
                 (VkDeviceMemory)
                 ((inputBufferAlloc.
                   super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)
                 ->m_memory).m_internal,
                 (inputBufferAlloc.
                  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)
                 ->m_offset,(ulong)this->m_bufferSize);
      makeBufferMemoryBarrier
                ((VkBufferMemoryBarrier *)&outputBufferCreateInfo,0x4000,0x800,
                 (VkBuffer)local_458.m_data.object.m_internal,0,(ulong)this->m_bufferSize);
      (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x6d])
                (vk,local_5a8.m_data.object,0x4000,0x1000,0,0,0,1,
                 (VkBufferMemoryBarrier *)&outputBufferCreateInfo,0,0);
      outputBufferCreateInfo._16_8_ = ZEXT48(this->m_bufferSize);
      outputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      outputBufferCreateInfo._4_4_ = 0;
      outputBufferCreateInfo.pNext = (void *)0x0;
      (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x5f])
                (vk,local_5a8.m_data.object,local_458.m_data.object.m_internal,
                 local_508.m_data.object.m_internal);
      makeBufferMemoryBarrier
                ((VkBufferMemoryBarrier *)&outputBufferCreateInfo,0x1000,0x800,
                 (VkBuffer)local_508.m_data.object.m_internal,0,(ulong)this->m_bufferSize);
      (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x6d])
                (vk,local_5a8.m_data.object,0x1000,0x1000,0,0,0,1,
                 (VkBufferMemoryBarrier *)&outputBufferCreateInfo,0,0);
      makeBufferCreateInfo(&outputBufferCreateInfo,(ulong)this->m_bufferSize,2);
      ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&sparseBufferBindInfo,
                         &vk->super_DeviceInterface,
                         (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                         super_RefBase<vk::VkDevice_s_*>.m_data.object,&outputBufferCreateInfo,
                         (VkAllocationCallbacks *)0x0);
      local_478.m_data.deleter.m_device = (VkDevice)sparseBufferBindInfo.pBinds;
      local_478.m_data.object.m_internal = sparseBufferBindInfo.buffer.m_internal;
      local_478.m_data.deleter.m_deviceIface = (DeviceInterface *)sparseBufferBindInfo._8_8_;
      sparseBufferBindInfo.buffer.m_internal = 0;
      sparseBufferBindInfo.bindCount = 0;
      sparseBufferBindInfo._12_4_ = 0;
      sparseBufferBindInfo.pBinds = (VkSparseMemoryBind *)0x0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&sparseBufferBindInfo);
      bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                 &sparseBufferBindInfo,&vk->super_DeviceInterface,
                 (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                 super_RefBase<vk::VkDevice_s_*>.m_data.object,
                 (this->super_SparseResourcesBaseInstance).m_allocator.
                 super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr,
                 (VkBuffer)local_478.m_data.object.m_internal,(MemoryRequirement)0x1);
      outputBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
      .ptr = (Allocation *)sparseBufferBindInfo.buffer;
      sparseBufferBindInfo.buffer.m_internal = 0;
      de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                 &sparseBufferBindInfo);
      sparseBufferBindInfo.pBinds = (VkSparseMemoryBind *)(ulong)this->m_bufferSize;
      sparseBufferBindInfo.buffer.m_internal = 0;
      sparseBufferBindInfo.bindCount = 0;
      sparseBufferBindInfo._12_4_ = 0;
      (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x5f])
                (vk,local_5a8.m_data.object,local_508.m_data.object.m_internal,
                 local_478.m_data.object.m_internal,1,&sparseBufferBindInfo);
      makeBufferMemoryBarrier
                ((VkBufferMemoryBarrier *)&sparseBufferBindInfo,0x1000,0x2000,
                 (VkBuffer)local_478.m_data.object.m_internal,0,(ulong)this->m_bufferSize);
      (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x6d])
                (vk,local_5a8.m_data.object,0x1000,0x4000,0,0,0,1,
                 (VkBufferMemoryBarrier *)&sparseBufferBindInfo,0,0);
      endCommandBuffer(&vk->super_DeviceInterface,local_5a8.m_data.object);
      waitStageBits[0] = 0x1000;
      submitCommandsAndWait
                (&vk->super_DeviceInterface,
                 (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                 super_RefBase<vk::VkDevice_s_*>.m_data.object,local_578->queueHandle,
                 local_5a8.m_data.object,1,(VkSemaphore *)&local_3c8,waitStageBits,0,
                 (VkSemaphore *)0x0);
      ::vk::invalidateMappedMemoryRange
                (&vk->super_DeviceInterface,
                 (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                 super_RefBase<vk::VkDevice_s_*>.m_data.object,
                 (VkDeviceMemory)
                 ((outputBufferAlloc.
                   super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)
                 ->m_memory).m_internal,
                 (outputBufferAlloc.
                  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)
                 ->m_offset,(ulong)this->m_bufferSize);
      __s2 = (outputBufferAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_hostPtr;
      (*(vk->super_DeviceInterface)._vptr_DeviceInterface[3])(vk,pQVar4->queueHandle);
      iVar3 = bcmp(referenceData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,__s2,(ulong)this->m_bufferSize);
      if (iVar3 == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&sparseBufferBindInfo,"Passed",&local_5ad);
        tcu::TestStatus::pass(__return_storage_ptr__,(string *)&sparseBufferBindInfo);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&sparseBufferBindInfo,"Failed",&local_5ad);
        tcu::TestStatus::fail(__return_storage_ptr__,(string *)&sparseBufferBindInfo);
      }
      std::__cxx11::string::~string((string *)&sparseBufferBindInfo);
      de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                (&outputBufferAlloc.
                  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_478);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&referenceData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                (&inputBufferAlloc.
                  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_458);
      ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_5a8);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_388);
    }
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
    ::~vector(&deviceMemUniquePtrVec);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::~RefBase(&local_3c8);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_508);
    return __return_storage_ptr__;
  }
  pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (pNVar6,"Required memory size for sparse resources exceeds device limits",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesBufferSparseBinding.cpp"
             ,0x95);
  __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestStatus BufferSparseBindingInstance::iterate (void)
{
	const InstanceInterface&	instance		= m_context.getInstanceInterface();
	const VkPhysicalDevice		physicalDevice	= m_context.getPhysicalDevice();

	if (!getPhysicalDeviceFeatures(instance, physicalDevice).sparseBinding)
		TCU_THROW(NotSupportedError, "Sparse binding not supported");

	{
		// Create logical device supporting both sparse and compute operations
		QueueRequirementsVec queueRequirements;
		queueRequirements.push_back(QueueRequirements(VK_QUEUE_SPARSE_BINDING_BIT, 1u));
		queueRequirements.push_back(QueueRequirements(VK_QUEUE_COMPUTE_BIT, 1u));

		createDeviceSupportingQueues(queueRequirements);
	}

	const DeviceInterface&	deviceInterface	= getDeviceInterface();
	const Queue&			sparseQueue		= getQueue(VK_QUEUE_SPARSE_BINDING_BIT, 0);
	const Queue&			computeQueue	= getQueue(VK_QUEUE_COMPUTE_BIT, 0);

	VkBufferCreateInfo bufferCreateInfo;

	bufferCreateInfo.sType					= VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;	// VkStructureType		sType;
	bufferCreateInfo.pNext					= DE_NULL;								// const void*			pNext;
	bufferCreateInfo.flags					= VK_BUFFER_CREATE_SPARSE_BINDING_BIT;	// VkBufferCreateFlags	flags;
	bufferCreateInfo.size					= m_bufferSize;							// VkDeviceSize			size;
	bufferCreateInfo.usage					= VK_BUFFER_USAGE_TRANSFER_SRC_BIT |
											  VK_BUFFER_USAGE_TRANSFER_DST_BIT;		// VkBufferUsageFlags	usage;
	bufferCreateInfo.sharingMode			= VK_SHARING_MODE_EXCLUSIVE;			// VkSharingMode		sharingMode;
	bufferCreateInfo.queueFamilyIndexCount	= 0u;									// deUint32				queueFamilyIndexCount;
	bufferCreateInfo.pQueueFamilyIndices	= DE_NULL;								// const deUint32*		pQueueFamilyIndices;

	const deUint32 queueFamilyIndices[] = { sparseQueue.queueFamilyIndex, computeQueue.queueFamilyIndex };

	if (sparseQueue.queueFamilyIndex != computeQueue.queueFamilyIndex)
	{
		bufferCreateInfo.sharingMode			= VK_SHARING_MODE_CONCURRENT;	// VkSharingMode		sharingMode;
		bufferCreateInfo.queueFamilyIndexCount	= 2u;							// deUint32				queueFamilyIndexCount;
		bufferCreateInfo.pQueueFamilyIndices	= queueFamilyIndices;			// const deUint32*		pQueueFamilyIndices;
	}

	// Create sparse buffer
	const Unique<VkBuffer> sparseBuffer(createBuffer(deviceInterface, getDevice(), &bufferCreateInfo));

	// Create sparse buffer memory bind semaphore
	const Unique<VkSemaphore> bufferMemoryBindSemaphore(createSemaphore(deviceInterface, getDevice()));

	const VkMemoryRequirements bufferMemRequirement = getBufferMemoryRequirements(deviceInterface, getDevice(), *sparseBuffer);

	if (bufferMemRequirement.size > getPhysicalDeviceProperties(instance, physicalDevice).limits.sparseAddressSpaceSize)
		TCU_THROW(NotSupportedError, "Required memory size for sparse resources exceeds device limits");

	DE_ASSERT((bufferMemRequirement.size % bufferMemRequirement.alignment) == 0);

	std::vector<DeviceMemorySp> deviceMemUniquePtrVec;

	{
		std::vector<VkSparseMemoryBind>	sparseMemoryBinds;
		const deUint32					numSparseBinds = static_cast<deUint32>(bufferMemRequirement.size / bufferMemRequirement.alignment);
		const deUint32					memoryType = findMatchingMemoryType(instance, physicalDevice, bufferMemRequirement, MemoryRequirement::Any);

		if (memoryType == NO_MATCH_FOUND)
			return tcu::TestStatus::fail("No matching memory type found");

		for (deUint32 sparseBindNdx = 0; sparseBindNdx < numSparseBinds; ++sparseBindNdx)
		{
			const VkSparseMemoryBind sparseMemoryBind = makeSparseMemoryBind(deviceInterface, getDevice(), bufferMemRequirement.alignment, memoryType, bufferMemRequirement.alignment * sparseBindNdx);

			deviceMemUniquePtrVec.push_back(makeVkSharedPtr(Move<VkDeviceMemory>(check<VkDeviceMemory>(sparseMemoryBind.memory), Deleter<VkDeviceMemory>(deviceInterface, getDevice(), DE_NULL))));

			sparseMemoryBinds.push_back(sparseMemoryBind);
		}

		const VkSparseBufferMemoryBindInfo sparseBufferBindInfo = makeSparseBufferMemoryBindInfo(*sparseBuffer, numSparseBinds, &sparseMemoryBinds[0]);

		const VkBindSparseInfo bindSparseInfo =
		{
			VK_STRUCTURE_TYPE_BIND_SPARSE_INFO,			//VkStructureType							sType;
			DE_NULL,									//const void*								pNext;
			0u,											//deUint32									waitSemaphoreCount;
			DE_NULL,									//const VkSemaphore*						pWaitSemaphores;
			1u,											//deUint32									bufferBindCount;
			&sparseBufferBindInfo,						//const VkSparseBufferMemoryBindInfo*		pBufferBinds;
			0u,											//deUint32									imageOpaqueBindCount;
			DE_NULL,									//const VkSparseImageOpaqueMemoryBindInfo*	pImageOpaqueBinds;
			0u,											//deUint32									imageBindCount;
			DE_NULL,									//const VkSparseImageMemoryBindInfo*		pImageBinds;
			1u,											//deUint32									signalSemaphoreCount;
			&bufferMemoryBindSemaphore.get()			//const VkSemaphore*						pSignalSemaphores;
		};

		// Submit sparse bind commands for execution
		VK_CHECK(deviceInterface.queueBindSparse(sparseQueue.queueHandle, 1u, &bindSparseInfo, DE_NULL));
	}

	// Create command buffer for transfer oparations
	const Unique<VkCommandPool>		commandPool(makeCommandPool(deviceInterface, getDevice(), computeQueue.queueFamilyIndex));
	const Unique<VkCommandBuffer>	commandBuffer(allocateCommandBuffer(deviceInterface, getDevice(), *commandPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	// Start recording transfer commands
	beginCommandBuffer(deviceInterface, *commandBuffer);

	const VkBufferCreateInfo		inputBufferCreateInfo = makeBufferCreateInfo(m_bufferSize, VK_BUFFER_USAGE_TRANSFER_SRC_BIT);
	const Unique<VkBuffer>			inputBuffer				(createBuffer(deviceInterface, getDevice(), &inputBufferCreateInfo));
	const de::UniquePtr<Allocation>	inputBufferAlloc		(bindBuffer(deviceInterface, getDevice(), getAllocator(), *inputBuffer, MemoryRequirement::HostVisible));

	std::vector<deUint8> referenceData;
	referenceData.resize(m_bufferSize);

	for (deUint32 valueNdx = 0; valueNdx < m_bufferSize; ++valueNdx)
	{
		referenceData[valueNdx] = static_cast<deUint8>((valueNdx % bufferMemRequirement.alignment) + 1u);
	}

	deMemcpy(inputBufferAlloc->getHostPtr(), &referenceData[0], m_bufferSize);

	flushMappedMemoryRange(deviceInterface, getDevice(), inputBufferAlloc->getMemory(), inputBufferAlloc->getOffset(), m_bufferSize);

	{
		const VkBufferMemoryBarrier inputBufferBarrier
			= makeBufferMemoryBarrier(	VK_ACCESS_HOST_WRITE_BIT,
										VK_ACCESS_TRANSFER_READ_BIT,
										*inputBuffer,
										0u,
										m_bufferSize);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u, 0u, DE_NULL, 1u, &inputBufferBarrier, 0u, DE_NULL);
	}

	{
		const VkBufferCopy bufferCopy = makeBufferCopy(0u, 0u, m_bufferSize);

		deviceInterface.cmdCopyBuffer(*commandBuffer, *inputBuffer, *sparseBuffer, 1u, &bufferCopy);
	}

	{
		const VkBufferMemoryBarrier sparseBufferBarrier
			= makeBufferMemoryBarrier(	VK_ACCESS_TRANSFER_WRITE_BIT,
										VK_ACCESS_TRANSFER_READ_BIT,
										*sparseBuffer,
										0u,
										m_bufferSize);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u, 0u, DE_NULL, 1u, &sparseBufferBarrier, 0u, DE_NULL);
	}

	const VkBufferCreateInfo		outputBufferCreateInfo	= makeBufferCreateInfo(m_bufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT);
	const Unique<VkBuffer>			outputBuffer			(createBuffer(deviceInterface, getDevice(), &outputBufferCreateInfo));
	const de::UniquePtr<Allocation>	outputBufferAlloc		(bindBuffer(deviceInterface, getDevice(), getAllocator(), *outputBuffer, MemoryRequirement::HostVisible));

	{
		const VkBufferCopy bufferCopy = makeBufferCopy(0u, 0u, m_bufferSize);

		deviceInterface.cmdCopyBuffer(*commandBuffer, *sparseBuffer, *outputBuffer, 1u, &bufferCopy);
	}

	{
		const VkBufferMemoryBarrier outputBufferBarrier
			= makeBufferMemoryBarrier(	VK_ACCESS_TRANSFER_WRITE_BIT,
										VK_ACCESS_HOST_READ_BIT,
										*outputBuffer,
										0u,
										m_bufferSize);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u, 0u, DE_NULL, 1u, &outputBufferBarrier, 0u, DE_NULL);
	}

	// End recording transfer commands
	endCommandBuffer(deviceInterface, *commandBuffer);

	const VkPipelineStageFlags waitStageBits[] = { VK_PIPELINE_STAGE_TRANSFER_BIT };

	// Submit transfer commands for execution and wait for completion
	submitCommandsAndWait(deviceInterface, getDevice(), computeQueue.queueHandle, *commandBuffer, 1u, &bufferMemoryBindSemaphore.get(), waitStageBits);

	// Retrieve data from output buffer to host memory
	invalidateMappedMemoryRange(deviceInterface, getDevice(), outputBufferAlloc->getMemory(), outputBufferAlloc->getOffset(), m_bufferSize);

	const deUint8* outputData = static_cast<const deUint8*>(outputBufferAlloc->getHostPtr());

	// Wait for sparse queue to become idle
	deviceInterface.queueWaitIdle(sparseQueue.queueHandle);

	// Compare output data with reference data
	if (deMemCmp(&referenceData[0], outputData, m_bufferSize) != 0)
		return tcu::TestStatus::fail("Failed");
	else
		return tcu::TestStatus::pass("Passed");
}